

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<int>,ImPlot::TransformerLogLog>
               (GetterYs<int> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  int iVar13;
  ImPlotContext *gp;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar10 = GImPlot;
  pIVar6 = GImPlot->CurrentPlot;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar12 = getter->Count;
    local_48 = iVar12 + -1;
    iVar12 = *(int *)((long)getter->Ys +
                     (long)((getter->Offset % iVar12 + iVar12) % iVar12) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar7 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar6->XAxis).Range.Min);
    pIVar6 = pIVar10->CurrentPlot;
    dVar2 = pIVar10->LogDenX;
    dVar3 = (pIVar6->XAxis).Range.Min;
    dVar4 = (pIVar6->XAxis).Range.Max;
    dVar8 = log10((double)iVar12 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar12 = transformer->YAxis;
    pIVar6 = pIVar10->CurrentPlot;
    auVar18._8_8_ = dVar8;
    auVar18._0_8_ = dVar7;
    auVar21._8_8_ = pIVar10->LogDenY[iVar12];
    auVar21._0_8_ = dVar2;
    auVar16 = divpd(auVar18,auVar21);
    dVar2 = pIVar6->YAxis[iVar12].Range.Min;
    IVar5 = pIVar10->PixelRange[iVar12].Min;
    local_3c.y = (float)(pIVar10->My[iVar12] *
                         (((double)(float)auVar16._8_8_ * (pIVar6->YAxis[iVar12].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
    local_3c.x = (float)(pIVar10->Mx *
                         (((double)(float)auVar16._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<int>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLogLog> *)local_58,
               DrawList,&pIVar6->PlotRect);
  }
  else {
    iVar12 = getter->Count;
    iVar12 = *(int *)((long)getter->Ys +
                     (long)((getter->Offset % iVar12 + iVar12) % iVar12) * (long)getter->Stride);
    dVar7 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar6->XAxis).Range.Min);
    pIVar6 = pIVar10->CurrentPlot;
    dVar2 = pIVar10->LogDenX;
    dVar3 = (pIVar6->XAxis).Range.Min;
    dVar4 = (pIVar6->XAxis).Range.Max;
    dVar8 = log10((double)iVar12 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar12 = transformer->YAxis;
    pIVar6 = pIVar10->CurrentPlot;
    auVar19._8_8_ = pIVar10->LogDenY[iVar12];
    auVar19._0_8_ = dVar2;
    auVar16._8_8_ = dVar8;
    auVar16._0_8_ = dVar7;
    auVar16 = divpd(auVar16,auVar19);
    dVar2 = pIVar6->YAxis[iVar12].Range.Min;
    IVar5 = pIVar10->PixelRange[iVar12].Min;
    local_58._4_4_ =
         (float)(pIVar10->My[iVar12] *
                 (((double)(float)auVar16._8_8_ * (pIVar6->YAxis[iVar12].Range.Max - dVar2) + dVar2)
                 - dVar2) + (double)IVar5.y);
    local_58._0_4_ =
         (float)(pIVar10->Mx *
                 (((double)(float)auVar16._0_8_ * (dVar4 - dVar3) + dVar3) -
                 (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
    iVar12 = getter->Count;
    if (1 < iVar12) {
      iVar13 = 1;
      do {
        pIVar11 = GImPlot;
        iVar12 = *(int *)((long)getter->Ys +
                         (long)(((getter->Offset + iVar13) % iVar12 + iVar12) % iVar12) *
                         (long)getter->Stride);
        dVar7 = log10(((double)iVar13 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar11->CurrentPlot;
        dVar2 = pIVar11->LogDenX;
        dVar3 = (pIVar6->XAxis).Range.Min;
        dVar4 = (pIVar6->XAxis).Range.Max;
        dVar8 = log10((double)iVar12 / pIVar6->YAxis[transformer->YAxis].Range.Min);
        iVar12 = transformer->YAxis;
        pIVar6 = pIVar11->CurrentPlot;
        auVar17._8_8_ = dVar8;
        auVar17._0_8_ = dVar7;
        auVar20._8_8_ = pIVar11->LogDenY[iVar12];
        auVar20._0_8_ = dVar2;
        auVar16 = divpd(auVar17,auVar20);
        dVar2 = pIVar6->YAxis[iVar12].Range.Min;
        IVar5 = pIVar11->PixelRange[iVar12].Min;
        fVar14 = (float)(pIVar11->Mx *
                         (((double)(float)auVar16._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar5.x);
        fVar15 = (float)(pIVar11->My[iVar12] *
                         (((double)(float)auVar16._8_8_ * (pIVar6->YAxis[iVar12].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar15;
        local_60.x = fVar14;
        pIVar6 = pIVar10->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (fVar15 <= (float)local_58._4_4_) {
          fVar9 = fVar15;
        }
        if ((fVar9 < (pIVar6->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(fVar15 <= (float)local_58._4_4_) & (uint)fVar15 |
                           local_58._4_4_ & -(uint)(fVar15 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (fVar14 <= (float)local_58._0_4_) {
            fVar9 = fVar14;
          }
          if ((fVar9 < (pIVar6->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(fVar14 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar14 <= (float)local_58._0_4_) & (uint)fVar14),
             (pIVar6->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar13 = iVar13 + 1;
        iVar12 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar13 < iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}